

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

DdGen * Cudd_zddFirstPath(DdManager *zdd,DdNode *f,int **path)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdGen *__ptr;
  int *__ptr_00;
  ulong uVar4;
  DdNode **ppDVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  DdNode *pDVar10;
  uint *puVar11;
  
  if (f != (DdNode *)0x0 && zdd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = zdd;
      __ptr->type = 3;
      *(undefined8 *)((long)&(__ptr->gen).cubes.value + 4) = 0;
      *(undefined8 *)&__ptr->status = 0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.cube + 4) = 0;
      (__ptr->stack).stack = (DdNode **)0x0;
      __ptr->node = (DdNode *)0x0;
      uVar1 = zdd->sizeZ;
      lVar9 = (long)(int)uVar1;
      __ptr_00 = (int *)malloc(lVar9 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      if (__ptr_00 == (int *)0x0) {
        zdd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        uVar4 = 0;
        uVar7 = 0;
        if (0 < (int)uVar1) {
          uVar7 = (ulong)uVar1;
        }
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          __ptr_00[uVar4] = 2;
        }
        ppDVar5 = (DdNode **)malloc(lVar9 * 8 + 8);
        (__ptr->stack).stack = ppDVar5;
        if (ppDVar5 != (DdNode **)0x0) {
          for (lVar8 = 0; lVar8 <= lVar9; lVar8 = lVar8 + 1) {
            ppDVar5[lVar8] = (DdNode *)0x0;
          }
          *ppDVar5 = f;
          iVar6 = 1;
          while( true ) {
            while( true ) {
              lVar9 = (long)iVar6;
              pDVar10 = (DdNode *)((ulong)ppDVar5[lVar9 + -1] & 0xfffffffffffffffe);
              if ((ulong)pDVar10->index == 0x7fffffff) break;
              __ptr_00[pDVar10->index] = 0;
              ppDVar5[lVar9] = (DdNode *)((ulong)(pDVar10->type).kids.E ^ 1);
              iVar6 = iVar6 + 1;
            }
            if (zdd->zero != pDVar10) break;
            pDVar10 = ppDVar5[lVar9 + -1];
            lVar9 = lVar9 + -1;
            while( true ) {
              if (lVar9 == 0) {
                __ptr->status = 0;
                (__ptr->stack).sp = 0;
                goto LAB_00749d74;
              }
              pDVar2 = ppDVar5[lVar9 + -1];
              puVar11 = (uint *)((ulong)pDVar2 & 0xfffffffffffffffe);
              pDVar3 = *(DdNode **)(puVar11 + 4);
              if (pDVar3 != pDVar10) break;
              __ptr_00[*puVar11] = 2;
              iVar6 = iVar6 + -1;
              pDVar10 = pDVar2;
              lVar9 = lVar9 + -1;
            }
            __ptr_00[*puVar11] = 1;
            ppDVar5[lVar9] = pDVar3;
          }
          (__ptr->stack).sp = iVar6;
          __ptr->status = 1;
          (__ptr->gen).cubes.value = (pDVar10->type).value;
LAB_00749d74:
          *path = __ptr_00;
          return __ptr;
        }
        zdd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_zddFirstPath(
  DdManager * zdd,
  DdNode * f,
  int ** path)
{
    DdGen *gen;
    DdNode *top, *next, *prev;
    int i;
    int nvars;

    /* Sanity Check. */
    if (zdd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = zdd;
    gen->type = CUDD_GEN_ZDD_PATHS;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = zdd->sizeZ;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first path of the ZDD. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    *path = gen->gen.cubes.cube;
    return(gen);

}